

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O3

QString * __thiscall
QSqlRelationalTableModel::selectStatement
          (QString *__return_storage_ptr__,QSqlRelationalTableModel *this)

{
  QSqlRecord *this_00;
  int *piVar1;
  QRelation *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  undefined1 auVar5 [8];
  char cVar6;
  int iVar7;
  int iVar8;
  QSqlDatabase *pQVar9;
  QSqlDriver *pQVar10;
  Node<QString,_int> *pNVar11;
  QSqlRelationalTableModelPrivate *pQVar12;
  long *plVar13;
  pointer pQVar14;
  QString *pQVar15;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> QVar16;
  undefined8 *puVar17;
  QString *pQVar18;
  qsizetype *pqVar19;
  long lVar20;
  fd_set *extraout_RDX;
  long lVar21;
  fd_set *extraout_RDX_00;
  type *ptVar22;
  fd_set *__writefds;
  QSqlRelationalTableModelPrivate *pQVar23;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> QVar24;
  QSqlRelationalTableModelPrivate *pQVar25;
  timeval *in_R8;
  qsizetype qVar26;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> QVar27;
  QSqlRelationalTableModelPrivate *pQVar28;
  long lVar29;
  QSqlRelationalTableModelPrivate *pQVar30;
  long lVar31;
  long in_FS_OFFSET;
  QByteArrayView QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QSqlRecord rec;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> local_250;
  QSqlRelationalTableModelPrivate *local_240;
  QSqlRelationalTableModelPrivate *local_238;
  QSqlRelationalTableModelPrivate *local_208;
  QSqlRelationalTableModelPrivate *local_200;
  QString *local_1f8;
  QSqlRelationalTableModelPrivate *local_1f0;
  char *local_1e8;
  QString local_1d8;
  QString local_1c0;
  type local_1a8;
  QString local_188;
  undefined1 local_168 [8];
  QSqlRelationalTableModelPrivate *pQStack_160;
  QSqlRelationalTableModelPrivate *local_158;
  QString local_148;
  undefined1 local_128 [8];
  undefined1 auStack_120 [8];
  undefined1 local_118 [16];
  QString local_108;
  QString local_e8;
  undefined1 local_c8 [8];
  Data *pDStack_c0;
  long local_b8;
  QString local_a8;
  QArrayDataPointer<QString> local_88;
  QHash<QString,_int> local_70;
  QStringBuilder<QStringBuilder<const_QLatin1String,_const_QString_&>,_const_QLatin1String> local_68
  ;
  quintptr local_38;
  
  local_38 = *(quintptr *)(in_FS_OFFSET + 0x28);
  pQVar30 = *(QSqlRelationalTableModelPrivate **)(this + 8);
  QSqlTableModel::tableName((QString *)&local_68,(QSqlTableModel *)this);
  pQVar15 = local_68.a.b;
  if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
      (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
    LOCK();
    *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
    UNLOCK();
    if (*(int *)local_68.a.a.m_size == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
    }
  }
  if ((QSqlRelationalTableModelPrivate *)pQVar15 == (QSqlRelationalTableModelPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_00133acd;
  }
  if ((pQVar30->relations).d.size == 0) {
    QSqlTableModel::selectStatement(__return_storage_ptr__,(QSqlTableModel *)this);
    goto LAB_00133acd;
  }
  local_70.d = (Data<QHashPrivate::Node<QString,_int>_> *)0x0;
  local_88.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  this_00 = &pQVar30->baseRec;
  pQVar12 = pQVar30;
  iVar7 = QSqlRecord::count(this_00);
  if (0 < iVar7) {
    pQVar9 = &(pQVar30->super_QSqlTableModelPrivate).db;
    lVar31 = 0;
    do {
      QList<QSharedPointer<QRelation>_>::value
                ((QList<QSharedPointer<QRelation>_> *)&local_68,(qsizetype)&pQVar30->relations);
      if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size ==
          (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        qVar26 = 0;
        pQVar25 = (QSqlRelationalTableModelPrivate *)0x0;
        pQVar28 = (QSqlRelationalTableModelPrivate *)0x0;
        pQVar23 = (QSqlRelationalTableModelPrivate *)0x0;
        local_238 = (QSqlRelationalTableModelPrivate *)0x0;
        pQVar12 = (QSqlRelationalTableModelPrivate *)0x0;
        local_240 = (QSqlRelationalTableModelPrivate *)0x0;
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
      }
      else {
        pQVar2 = (pQVar30->relations).d.ptr[lVar31].value.ptr;
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(pQVar2->rel).tName.d.d;
        local_240 = (QSqlRelationalTableModelPrivate *)(pQVar2->rel).tName.d.ptr;
        pQVar12 = (QSqlRelationalTableModelPrivate *)(pQVar2->rel).tName.d.size;
        if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)&((QSqlTableModelPrivate *)
                   &((QSqlRecordPrivate *)local_250.d.ptr)->super_QSharedData)->
                   super_QSqlQueryModelPrivate =
               *(int *)&((QSqlTableModelPrivate *)
                        &((QSqlRecordPrivate *)local_250.d.ptr)->super_QSharedData)->
                        super_QSqlQueryModelPrivate + 1;
          UNLOCK();
        }
        local_238 = (QSqlRelationalTableModelPrivate *)(pQVar2->rel).iColumn.d.d;
        qVar26 = (pQVar2->rel).iColumn.d.size;
        if (local_238 != (QSqlRelationalTableModelPrivate *)0x0) {
          LOCK();
          (((QArrayData *)&((QArrayData *)local_238)->ref_)->ref_)._q_value.super___atomic_base<int>
          ._M_i = (((QArrayData *)&((QArrayData *)local_238)->ref_)->ref_)._q_value.
                  super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pQVar25 = (QSqlRelationalTableModelPrivate *)(pQVar2->rel).dColumn.d.d;
        pQVar28 = (QSqlRelationalTableModelPrivate *)(pQVar2->rel).dColumn.d.ptr;
        pQVar23 = (QSqlRelationalTableModelPrivate *)(pQVar2->rel).dColumn.d.size;
        if (pQVar25 == (QSqlRelationalTableModelPrivate *)0x0) {
          pQVar25 = (QSqlRelationalTableModelPrivate *)0x0;
        }
        else {
          LOCK();
          *(__int_type *)&(pQVar25->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
               (__int_type)
               *(__atomic_base<int> *)
                &(pQVar25->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate + 1;
          UNLOCK();
        }
      }
      QSharedPointer<QRelation>::deref((Data *)local_68.a.a.m_data);
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char16_t *)0x0;
      local_a8.d.size = 0;
      if (((pQVar12 == (QSqlRelationalTableModelPrivate *)0x0) || (qVar26 == 0)) ||
         (pQVar23 == (QSqlRelationalTableModelPrivate *)0x0)) {
        QSqlRecord::fieldName((QString *)&local_68,this_00,(int)lVar31);
        pQVar15 = local_68.a.b;
        qVar26 = local_68.a.a.m_size;
        pcVar4 = local_a8.d.ptr;
        pDVar3 = local_a8.d.d;
        local_68.a.a.m_size = (qsizetype)local_a8.d.d;
        local_a8.d.d = (Data *)qVar26;
        local_a8.d.ptr = (char16_t *)local_68.a.a.m_data;
        local_68.a.a.m_data = (char *)pcVar4;
        local_68.a.b = (QString *)local_a8.d.size;
        local_a8.d.size = (qsizetype)pQVar15;
        if ((QSqlRecordPrivate *)pDVar3 != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)pDVar3 = *(int *)pDVar3 + -1;
          UNLOCK();
          if (*(int *)pDVar3 == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        if (pQVar25 != (QSqlRelationalTableModelPrivate *)0x0) {
          LOCK();
          *(__int_type *)&(pQVar25->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
               (__int_type)
               *(__atomic_base<int> *)
                &(pQVar25->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate + 1;
          UNLOCK();
        }
        local_a8.d.d = (Data *)pQVar25;
        local_a8.d.ptr = (char16_t *)pQVar28;
        local_a8.d.size = (qsizetype)pQVar23;
        pQVar10 = QSqlDatabase::driver(pQVar9);
        cVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,&local_a8,0);
        if (cVar6 != '\0') {
          pQVar10 = QSqlDatabase::driver(pQVar9);
          in_R8 = *(timeval **)pQVar10;
          (*(code *)in_R8[0xf].tv_usec)(&local_68,pQVar10,&local_a8,0);
          pQVar15 = local_68.a.b;
          qVar26 = local_68.a.a.m_size;
          pcVar4 = local_a8.d.ptr;
          pDVar3 = local_a8.d.d;
          local_68.a.a.m_size = (qsizetype)local_a8.d.d;
          local_a8.d.d = (Data *)qVar26;
          local_a8.d.ptr = (char16_t *)local_68.a.a.m_data;
          local_68.a.a.m_data = (char *)pcVar4;
          local_68.a.b = (QString *)local_a8.d.size;
          local_a8.d.size = (qsizetype)pQVar15;
          if ((QSqlRecordPrivate *)pDVar3 != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(int *)pDVar3 = *(int *)pDVar3 + -1;
            UNLOCK();
            if (*(int *)pDVar3 == 0) {
              QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
            }
          }
        }
        local_c8 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
        QSqlTableModel::database((QSqlTableModel *)&local_e8);
        local_68.a.a.m_size = (qsizetype)local_250.d.ptr;
        local_68.a.a.m_data = (char *)local_240;
        if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)local_250.d.ptr = *(int *)local_250.d.ptr + 1;
          UNLOCK();
        }
        local_68.a.b = (QString *)pQVar12;
        QSqlDatabase::record((QSqlDatabase *)local_c8,&local_e8);
        if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
            (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
          LOCK();
          *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
          UNLOCK();
          if (*(int *)local_68.a.a.m_size == 0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        QSqlDatabase::~QSqlDatabase((QSqlDatabase *)&local_e8);
        iVar7 = QSqlRecord::count((QSqlRecord *)local_c8);
        if (0 < iVar7) {
          iVar7 = 0;
          do {
            QSqlRecord::fieldName((QString *)&local_68,(QSqlRecord *)local_c8,iVar7);
            iVar8 = QString::compare(&local_a8,(CaseSensitivity)&local_68);
            if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
                (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
              LOCK();
              *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
              UNLOCK();
              if (*(int *)local_68.a.a.m_size == 0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
            if (iVar8 == 0) {
              QSqlRecord::fieldName((QString *)&local_68,(QSqlRecord *)local_c8,iVar7);
              pQVar15 = local_68.a.b;
              qVar26 = local_68.a.a.m_size;
              pcVar4 = local_a8.d.ptr;
              pDVar3 = local_a8.d.d;
              local_68.a.a.m_size = (qsizetype)local_a8.d.d;
              local_a8.d.d = (Data *)qVar26;
              local_a8.d.ptr = (char16_t *)local_68.a.a.m_data;
              local_68.a.a.m_data = (char *)pcVar4;
              local_68.a.b = (QString *)local_a8.d.size;
              local_a8.d.size = (qsizetype)pQVar15;
              if ((QSqlRecordPrivate *)pDVar3 != (QSqlRecordPrivate *)0x0) {
                LOCK();
                *(int *)pDVar3 = *(int *)pDVar3 + -1;
                UNLOCK();
                if (*(int *)pDVar3 == 0) {
                  QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
                }
              }
              break;
            }
            iVar7 = iVar7 + 1;
            iVar8 = QSqlRecord::count((QSqlRecord *)local_c8);
          } while (iVar7 < iVar8);
        }
        QSqlRecord::~QSqlRecord((QSqlRecord *)local_c8);
      }
      iVar7 = 1;
      if ((local_70.d != (Data<QHashPrivate::Node<QString,_int>_> *)0x0) &&
         (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                              (local_70.d,&local_a8), pNVar11 != (Node<QString,_int> *)0x0)) {
        iVar7 = pNVar11->value + 1;
      }
      QHash<QString,int>::tryEmplace_impl<QString_const&>
                ((TryEmplaceResult *)&local_68,&local_70,&local_a8);
      lVar20 = ((ulong)local_68.a.a.m_data >> 7) * 0x90;
      pQVar12 = (QSqlRelationalTableModelPrivate *)
                ((ulong)*(byte *)((ulong)((uint)local_68.a.a.m_data & 0x7f) +
                                 *(long *)(local_68.a.a.m_size + 0x20) + lVar20) * 0x20);
      *(int *)(&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate.field_0x18 +
              *(long *)(*(long *)(local_68.a.a.m_size + 0x20) + 0x80 + lVar20)) = iVar7;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_a8);
      QList<QString>::end((QList<QString> *)&local_88);
      if ((QSqlRelationalTableModelPrivate *)local_a8.d.d != (QSqlRelationalTableModelPrivate *)0x0)
      {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)&(local_a8.d.d)->super_QArrayData)->
                 super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)&(local_a8.d.d)->super_QArrayData)->
                      super_QSqlQueryModelPrivate + -1;
        UNLOCK();
        if (*(int *)&((QSqlTableModelPrivate *)&(local_a8.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (pQVar25 != (QSqlRelationalTableModelPrivate *)0x0) {
        LOCK();
        *(__int_type *)&(pQVar25->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
             (__int_type)
             *(__atomic_base<int> *)
              &(pQVar25->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate + -1;
        UNLOCK();
        if ((__int_type)
            *(__atomic_base<int> *)
             &(pQVar25->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate == 0) {
          QArrayData::deallocate((QArrayData *)pQVar25,2,0x10);
        }
      }
      if (local_238 != (QSqlRelationalTableModelPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&local_238->super_QSqlTableModelPrivate)->_q_value).
        super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&local_238->super_QSqlTableModelPrivate)->_q_value).
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&local_238->super_QSqlTableModelPrivate)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_238,2,0x10);
        }
      }
      if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)local_250.d.ptr = *(int *)local_250.d.ptr + -1;
        UNLOCK();
        if (*(int *)local_250.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_250.d.ptr,2,0x10);
        }
      }
      lVar31 = lVar31 + 1;
      iVar7 = QSqlRecord::count(this_00);
    } while (lVar31 < iVar7);
  }
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  local_a8.d.size = 0;
  local_b8 = 0;
  local_c8 = (undefined1  [8])0x0;
  pDStack_c0 = (Data *)0x0;
  local_e8.d.size = -0x5555555555555556;
  local_e8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_e8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QSqlTableModel::tableName((QString *)&local_68,(QSqlTableModel *)this);
  QSqlQueryModelSql::from(&local_e8,(QString *)&local_68);
  if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
      (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
    LOCK();
    *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
    UNLOCK();
    if (*(int *)local_68.a.a.m_size == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
    }
  }
  iVar7 = QSqlRecord::count(this_00);
  __writefds = extraout_RDX;
  if (0 < iVar7) {
    pQVar9 = &(pQVar30->super_QSqlTableModelPrivate).db;
    lVar29 = 0;
    lVar20 = 0;
    lVar31 = 0;
    do {
      QList<QSharedPointer<QRelation>_>::value
                ((QList<QSharedPointer<QRelation>_> *)&local_68,(qsizetype)&pQVar30->relations);
      if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size ==
          (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        QVar24.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
        local_200 = (QSqlRelationalTableModelPrivate *)0x0;
        local_238 = (QSqlRelationalTableModelPrivate *)0x0;
        QVar27.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
        local_1e8 = (char *)0x0;
        local_1f8 = (QString *)0x0;
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
        local_1f0 = (QSqlRelationalTableModelPrivate *)0x0;
        local_208 = (QSqlRelationalTableModelPrivate *)0x0;
      }
      else {
        plVar13 = *(long **)((long)&(((pQVar30->relations).d.ptr)->value).ptr + lVar20);
        QVar24.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)*plVar13;
        local_200 = (QSqlRelationalTableModelPrivate *)plVar13[1];
        local_238 = (QSqlRelationalTableModelPrivate *)plVar13[2];
        if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(__int_type *)
           &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar24.d.ptr)->super_QSharedData)->
            super_QSqlQueryModelPrivate =
               (__int_type)
               *(__atomic_base<int> *)
                &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar24.d.ptr)->super_QSharedData)
                 ->super_QSqlQueryModelPrivate + 1;
          UNLOCK();
        }
        QVar27.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)plVar13[3];
        local_1e8 = (char *)plVar13[4];
        local_1f8 = (QString *)plVar13[5];
        if (QVar27.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&((QSqlRecordPrivate *)QVar27.d.ptr)->super_QSharedData)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&((QSqlRecordPrivate *)QVar27.d.ptr)->super_QSharedData)->
               _q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)plVar13[6];
        local_1f0 = (QSqlRelationalTableModelPrivate *)plVar13[7];
        local_208 = (QSqlRelationalTableModelPrivate *)plVar13[8];
        if (local_250.d.ptr == (QSqlRecordPrivate *)0x0) {
          local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
        }
        else {
          LOCK();
          *(int *)&((QSqlTableModelPrivate *)
                   &((QSqlRecordPrivate *)local_250.d.ptr)->super_QSharedData)->
                   super_QSqlQueryModelPrivate =
               *(int *)&((QSqlTableModelPrivate *)
                        &((QSqlRecordPrivate *)local_250.d.ptr)->super_QSharedData)->
                        super_QSqlQueryModelPrivate + 1;
          UNLOCK();
        }
      }
      QSharedPointer<QRelation>::deref((Data *)local_68.a.a.m_data);
      local_108.d.size = -0x5555555555555556;
      local_108.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_108.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QSqlTableModel::tableName((QString *)&local_68,(QSqlTableModel *)this);
      pQVar12 = (QSqlRelationalTableModelPrivate *)QSqlDatabase::driver(pQVar9);
      QSqlRecord::fieldName(&local_148,this_00,(int)lVar31);
      (**(code **)(*(long *)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate +
                  0xa0))((QString *)local_128,pQVar12,&local_148,0);
      QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                (&local_108,pQVar12,(QString *)&local_68,(QString *)local_128);
      if (local_128 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate + -1;
        UNLOCK();
        if (*(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate == 0) {
          QArrayData::deallocate((QArrayData *)local_128,2,0x10);
        }
      }
      if ((QSqlRelationalTableModelPrivate *)local_148.d.d != (QSqlRelationalTableModelPrivate *)0x0
         ) {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                 super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                      super_QSqlQueryModelPrivate + -1;
        UNLOCK();
        if (*(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate == 0) {
          QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
          (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        LOCK();
        *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
        UNLOCK();
        if (*(int *)local_68.a.a.m_size == 0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
      if (((local_238 == (QSqlRelationalTableModelPrivate *)0x0) || (local_1f8 == (QString *)0x0))
         || (local_208 == (QSqlRelationalTableModelPrivate *)0x0)) {
        pQVar15 = &local_108;
        if (((QSqlRelationalTableModelPrivate *)local_a8.d.size ==
             (QSqlRelationalTableModelPrivate *)0x0) ||
           (pQVar15 = &local_a8,
           (QSqlRelationalTableModelPrivate *)local_108.d.size ==
           (QSqlRelationalTableModelPrivate *)0x0)) {
          local_128 = (undefined1  [8])(pQVar15->d).d;
          auStack_120 = (undefined1  [8])(pQVar15->d).ptr;
          pQVar12 = (QSqlRelationalTableModelPrivate *)(pQVar15->d).size;
          local_118._0_8_ = pQVar12;
          if (local_128 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QSqlRelationalTableModelPrivate *)local_128)->super_QSqlTableModelPrivate).
                     super_QSqlQueryModelPrivate =
                 (int)*(Type *)&(((QSqlRelationalTableModelPrivate *)local_128)->
                                super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate + 1;
            UNLOCK();
          }
        }
        else {
          local_68.a.a.m_size = (qsizetype)local_a8.d.d;
          local_68.a.a.m_data = (char *)local_a8.d.ptr;
          local_68.a.b = (QString *)local_a8.d.size;
          if ((QSqlRecordPrivate *)local_a8.d.d != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(int *)local_a8.d.d = *(int *)local_a8.d.d + 1;
            UNLOCK();
          }
          QVar34.m_data = (char *)0x1;
          QVar34.m_size = (qsizetype)&local_68;
          pQVar15 = (QString *)QString::append(QVar34);
          puVar17 = (undefined8 *)QString::append(pQVar15);
          pQVar12 = (QSqlRelationalTableModelPrivate *)*puVar17;
          auStack_120 = (undefined1  [8])puVar17[1];
          local_118._0_8_ = puVar17[2];
          if (pQVar12 != (QSqlRelationalTableModelPrivate *)0x0) {
            LOCK();
            *(int *)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
                 (int)*(Type *)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate +
                 1;
            UNLOCK();
          }
          local_128 = (undefined1  [8])pQVar12;
          if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
              (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
            UNLOCK();
            if (*(int *)local_68.a.a.m_size == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        QString::operator=(&local_a8,(QString *)local_128);
      }
      else {
        local_118._0_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_128 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
        auStack_120 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
        QString::number((int)&local_68,(int)lVar31);
        pQVar12 = (QSqlRelationalTableModelPrivate *)0x0;
        plVar13 = (long *)QString::insert((longlong)&local_68,(QLatin1String)(ZEXT816(9) << 0x40));
        local_128 = (undefined1  [8])*plVar13;
        auStack_120 = (undefined1  [8])plVar13[1];
        local_118._0_8_ = plVar13[2];
        if (local_128 != (undefined1  [8])0x0) {
          LOCK();
          *(__int_type *)
           &(((QSqlRelationalTableModelPrivate *)local_128)->super_QSqlTableModelPrivate).
            super_QSqlQueryModelPrivate =
               (__int_type)
               *(__atomic_base<int> *)
                &(((QSqlRelationalTableModelPrivate *)local_128)->super_QSqlTableModelPrivate).
                 super_QSqlQueryModelPrivate + 1;
          UNLOCK();
        }
        if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
            (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
          LOCK();
          *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
          UNLOCK();
          if (*(int *)local_68.a.a.m_size == 0) {
            pQVar12 = (QSqlRelationalTableModelPrivate *)0x2;
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        local_148.d.size = -0x5555555555555556;
        local_148.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_148.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_68.a.a.m_size = (qsizetype)local_250.d.ptr;
        local_68.a.a.m_data = (char *)local_1f0;
        local_68.a.b = (QString *)local_208;
        if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)local_250.d.ptr = *(int *)local_250.d.ptr + 1;
          UNLOCK();
        }
        QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                  (&local_148,pQVar12,(QString *)local_128,(QString *)&local_68);
        if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
            (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
          LOCK();
          *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
          UNLOCK();
          if (*(int *)local_68.a.a.m_size == 0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        pQVar14 = QList<QString>::data((QList<QString> *)&local_88);
        if (((local_70.d != (Data<QHashPrivate::Node<QString,_int>_> *)0x0) &&
            (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                                 (local_70.d,(QString *)((long)&(pQVar14->d).d + lVar29)),
            pNVar11 != (Node<QString,_int> *)0x0)) && (1 < pNVar11->value)) {
          local_158 = (QSqlRelationalTableModelPrivate *)0xaaaaaaaaaaaaaaaa;
          local_168 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
          pQStack_160 = (QSqlRelationalTableModelPrivate *)0xaaaaaaaaaaaaaaaa;
          local_188.d.ptr = (char16_t *)local_200;
          local_188.d.size = (qsizetype)local_238;
          if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(int *)QVar24.d.ptr = *(int *)QVar24.d.ptr + 1;
            UNLOCK();
          }
          local_188.d.d = (Data *)QVar24.d.ptr;
          QString::QString((QString *)&local_68,(QChar)0x2e);
          QString::section(local_168,&local_188,&local_68,0xffffffffffffffff,0xffffffffffffffff,0);
          if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
              (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
            UNLOCK();
            if (*(int *)local_68.a.a.m_size == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
          if ((QSqlRelationalTableModelPrivate *)local_188.d.d !=
              (QSqlRelationalTableModelPrivate *)0x0) {
            LOCK();
            *(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate =
                 *(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                          super_QSqlQueryModelPrivate + -1;
            UNLOCK();
            if (*(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                         super_QSqlQueryModelPrivate == 0) {
              QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
            }
          }
          pQVar10 = QSqlDatabase::driver(pQVar9);
          cVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,local_168,1);
          if (cVar6 != '\0') {
            pQVar10 = QSqlDatabase::driver(pQVar9);
            (**(code **)(*(long *)pQVar10 + 0xf8))(&local_68,pQVar10,local_168,1);
            pQVar15 = local_68.a.b;
            qVar26 = local_68.a.a.m_size;
            pQVar12 = pQStack_160;
            auVar5 = local_168;
            local_68.a.a.m_size = (qsizetype)local_168;
            local_168 = (undefined1  [8])qVar26;
            pQStack_160 = (QSqlRelationalTableModelPrivate *)local_68.a.a.m_data;
            local_68.a.a.m_data = (char *)pQVar12;
            local_68.a.b = (QString *)local_158;
            local_158 = (QSqlRelationalTableModelPrivate *)pQVar15;
            if (auVar5 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)auVar5 = *(int *)auVar5 + -1;
              UNLOCK();
              if (*(int *)auVar5 == 0) {
                QArrayData::deallocate((QArrayData *)auVar5,2,0x10);
              }
            }
          }
          local_188.d.d = (Data *)local_250.d.ptr;
          local_188.d.ptr = (char16_t *)local_1f0;
          local_188.d.size = (qsizetype)local_208;
          if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(int *)local_250.d.ptr = *(int *)local_250.d.ptr + 1;
            UNLOCK();
          }
          pQVar10 = QSqlDatabase::driver(pQVar9);
          cVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,&local_188,0);
          if (cVar6 != '\0') {
            pQVar10 = QSqlDatabase::driver(pQVar9);
            (**(code **)(*(long *)pQVar10 + 0xf8))(&local_68,pQVar10,&local_188,0);
            pQVar15 = local_68.a.b;
            qVar26 = local_68.a.a.m_size;
            pcVar4 = local_188.d.ptr;
            pDVar3 = local_188.d.d;
            local_68.a.a.m_size = (qsizetype)local_188.d.d;
            local_188.d.d = (Data *)qVar26;
            local_188.d.ptr = (char16_t *)local_68.a.a.m_data;
            local_68.a.a.m_data = (char *)pcVar4;
            local_68.a.b = (QString *)local_188.d.size;
            local_188.d.size = (qsizetype)pQVar15;
            if ((QSqlRecordPrivate *)pDVar3 != (QSqlRecordPrivate *)0x0) {
              LOCK();
              *(int *)pDVar3 = *(int *)pDVar3 + -1;
              UNLOCK();
              if (*(int *)pDVar3 == 0) {
                QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
              }
            }
          }
          local_1a8.d.size = -0x5555555555555556;
          local_1a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_1a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          QVar32.m_data = (storage_type *)0x8;
          QVar32.m_size = (qsizetype)&local_68;
          QString::fromLatin1(QVar32);
          pQVar14 = QList<QString>::data((QList<QString> *)&local_88);
          iVar7 = 0;
          if ((local_70.d != (Data<QHashPrivate::Node<QString,_int>_> *)0x0) &&
             (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                                  (local_70.d,(QString *)((long)&(pQVar14->d).d + lVar29)),
             iVar7 = 0, pNVar11 != (Node<QString,_int> *)0x0)) {
            iVar7 = pNVar11->value;
          }
          QString::number((int)&local_1c0,iVar7);
          QString::arg<QString&,QString&,QString>
                    (&local_1a8,(QString *)&local_68,(QString *)local_168,&local_188,&local_1c0);
          if ((QSqlRelationalTableModelPrivate *)local_1c0.d.d !=
              (QSqlRelationalTableModelPrivate *)0x0) {
            LOCK();
            *(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate =
                 *(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                          super_QSqlQueryModelPrivate + -1;
            UNLOCK();
            if (*(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                         super_QSqlQueryModelPrivate == 0) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
              (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
            UNLOCK();
            if (*(int *)local_68.a.a.m_size == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
          pQVar10 = QSqlDatabase::driver(pQVar9);
          (**(code **)(*(long *)pQVar10 + 0x100))(pQVar10,0);
          QString::truncate((longlong)&local_1a8);
          pQVar10 = QSqlDatabase::driver(pQVar9);
          in_R8 = *(timeval **)pQVar10;
          (*(code *)in_R8[10].tv_sec)(&local_68,pQVar10,&local_1a8,0);
          pQVar15 = local_68.a.b;
          qVar26 = local_68.a.a.m_size;
          pcVar4 = local_1a8.d.ptr;
          pDVar3 = local_1a8.d.d;
          local_68.a.a.m_size = (qsizetype)local_1a8.d.d;
          local_1a8.d.d = (Data *)qVar26;
          local_1a8.d.ptr = (char16_t *)local_68.a.a.m_data;
          local_68.a.a.m_data = (char *)pcVar4;
          local_68.a.b = (QString *)local_1a8.d.size;
          local_1a8.d.size = (qsizetype)pQVar15;
          if ((QSqlRecordPrivate *)pDVar3 != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(int *)pDVar3 = *(int *)pDVar3 + -1;
            UNLOCK();
            if (*(int *)pDVar3 == 0) {
              QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
            }
          }
          QSqlQueryModelSql::as((QString *)&local_68,&local_148,&local_1a8);
          QString::operator=(&local_148,(QString *)&local_68);
          if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
              (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
            UNLOCK();
            if (*(int *)local_68.a.a.m_size == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
          pQVar14 = QList<QString>::data((QList<QString> *)&local_88);
          QHash<QString,int>::tryEmplace_impl<QString_const&>
                    ((TryEmplaceResult *)&local_68,&local_70,
                     (QString *)((long)&(pQVar14->d).d + lVar29));
          lVar21 = ((ulong)local_68.a.a.m_data >> 7) * 0x90;
          piVar1 = (int *)(*(long *)(*(long *)(local_68.a.a.m_size + 0x20) + 0x80 + lVar21) + 0x18 +
                          (ulong)*(byte *)((ulong)((uint)local_68.a.a.m_data & 0x7f) +
                                          *(long *)(local_68.a.a.m_size + 0x20) + lVar21) * 0x20);
          *piVar1 = *piVar1 + -1;
          if ((QSqlRelationalTableModelPrivate *)local_1a8.d.d !=
              (QSqlRelationalTableModelPrivate *)0x0) {
            LOCK();
            *(int *)&((QSqlTableModelPrivate *)&(local_1a8.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate =
                 *(int *)&((QSqlTableModelPrivate *)&(local_1a8.d.d)->super_QArrayData)->
                          super_QSqlQueryModelPrivate + -1;
            UNLOCK();
            if (*(int *)&((QSqlTableModelPrivate *)&(local_1a8.d.d)->super_QArrayData)->
                         super_QSqlQueryModelPrivate == 0) {
              QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QSqlRelationalTableModelPrivate *)local_188.d.d !=
              (QSqlRelationalTableModelPrivate *)0x0) {
            LOCK();
            *(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate =
                 *(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                          super_QSqlQueryModelPrivate + -1;
            UNLOCK();
            if (*(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                         super_QSqlQueryModelPrivate == 0) {
              QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_168 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate =
                 *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate + -1;
            UNLOCK();
            if (*(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate == 0) {
              QArrayData::deallocate((QArrayData *)local_168,2,0x10);
            }
          }
        }
        pQVar15 = &local_148;
        if (((QSqlRelationalTableModelPrivate *)local_a8.d.size ==
             (QSqlRelationalTableModelPrivate *)0x0) || (pQVar15 = &local_a8, local_148.d.size == 0)
           ) {
          local_168 = (undefined1  [8])(pQVar15->d).d;
          pQStack_160 = (QSqlRelationalTableModelPrivate *)(pQVar15->d).ptr;
          local_158 = (QSqlRelationalTableModelPrivate *)(pQVar15->d).size;
          if (local_168 != (undefined1  [8])0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_168)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_168)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          local_68.a.a.m_size = (qsizetype)local_a8.d.d;
          local_68.a.a.m_data = (char *)local_a8.d.ptr;
          local_68.a.b = (QString *)local_a8.d.size;
          if ((QSqlRecordPrivate *)local_a8.d.d != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(int *)local_a8.d.d = *(int *)local_a8.d.d + 1;
            UNLOCK();
          }
          QVar33.m_data = (char *)0x1;
          QVar33.m_size = (qsizetype)&local_68;
          pQVar15 = (QString *)QString::append(QVar33);
          plVar13 = (long *)QString::append(pQVar15);
          local_168 = (undefined1  [8])*plVar13;
          pQStack_160 = (QSqlRelationalTableModelPrivate *)plVar13[1];
          local_158 = (QSqlRelationalTableModelPrivate *)plVar13[2];
          if (local_168 != (undefined1  [8])0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_168)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_168)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
              (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
            UNLOCK();
            if (*(int *)local_68.a.a.m_size == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        QString::operator=(&local_a8,(QString *)local_168);
        if (local_168 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_168)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_168)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_168)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_168,2,0x10);
          }
        }
        local_158 = (QSqlRelationalTableModelPrivate *)0xaaaaaaaaaaaaaaaa;
        local_168 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
        pQStack_160 = (QSqlRelationalTableModelPrivate *)0xaaaaaaaaaaaaaaaa;
        local_188.d.d = (Data *)local_200;
        local_1a8.d.d = (Data *)local_238;
        if (QVar24.d.ptr == (QSqlRecordPrivate *)0x0) {
LAB_00132c17:
          pQVar15 = &local_188;
          ptVar22 = &local_1a8;
          QVar16.d.ptr = QVar24.d.ptr;
          if ((QSqlRelationalTableModelPrivate *)local_118._0_8_ ==
              (QSqlRelationalTableModelPrivate *)0x0) goto LAB_00132cf9;
          local_68.a.a.m_data = (char *)local_200;
          local_68.a.b = (QString *)local_238;
          if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(int *)QVar24.d.ptr = *(int *)QVar24.d.ptr + 1;
            UNLOCK();
          }
          QVar35.m_data = (char *)0x1;
          QVar35.m_size = (qsizetype)&local_68;
          local_68.a.a.m_size = (qsizetype)QVar24.d.ptr;
          pQVar15 = (QString *)QString::append(QVar35);
          local_238 = (QSqlRelationalTableModelPrivate *)local_128;
          plVar13 = (long *)QString::append(pQVar15);
          local_168 = (undefined1  [8])*plVar13;
          pQStack_160 = (QSqlRelationalTableModelPrivate *)plVar13[1];
          local_158 = (QSqlRelationalTableModelPrivate *)plVar13[2];
          if (local_168 != (undefined1  [8])0x0) {
            LOCK();
            *(__int_type *)
             &(((QSqlRelationalTableModelPrivate *)local_168)->super_QSqlTableModelPrivate).
              super_QSqlQueryModelPrivate =
                 (__int_type)
                 *(__atomic_base<int> *)
                  &(((QSqlRelationalTableModelPrivate *)local_168)->super_QSqlTableModelPrivate).
                   super_QSqlQueryModelPrivate + 1;
            UNLOCK();
          }
          if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
              (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
            UNLOCK();
            if (*(int *)local_68.a.a.m_size == 0) {
              local_238 = (QSqlRelationalTableModelPrivate *)0x2;
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        else {
          LOCK();
          *(int *)QVar24.d.ptr = *(int *)QVar24.d.ptr + 1;
          UNLOCK();
          if (local_238 != (QSqlRelationalTableModelPrivate *)0x0) goto LAB_00132c17;
          pQVar15 = (QString *)auStack_120;
          ptVar22 = (type *)(auStack_120 + 8);
          QVar16.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)
                         (totally_ordered_wrapper<QSqlRecordPrivate_*>)local_128;
LAB_00132cf9:
          local_168 = (undefined1  [8])QVar16.d.ptr;
          pQStack_160 = (QSqlRelationalTableModelPrivate *)(pQVar15->d).d;
          local_158 = (QSqlRelationalTableModelPrivate *)(ptVar22->d).d;
          if (QVar16.d.ptr != (QSqlRecordPrivate *)0x0) {
            LOCK();
            *(__int_type *)
             &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar16.d.ptr)->super_QSharedData)->
              super_QSqlQueryModelPrivate =
                 (__int_type)
                 *(__atomic_base<int> *)
                  &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar16.d.ptr)->super_QSharedData
                   )->super_QSqlQueryModelPrivate + 1;
            UNLOCK();
          }
        }
        if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)QVar24.d.ptr = *(int *)QVar24.d.ptr + -1;
          UNLOCK();
          if (*(int *)QVar24.d.ptr == 0) {
            local_238 = (QSqlRelationalTableModelPrivate *)0x2;
            QArrayData::deallocate((QArrayData *)QVar24.d.ptr,2,0x10);
          }
        }
        local_188.d.size = -0x5555555555555556;
        local_188.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_188.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_68.a.a.m_data = local_1e8;
        local_68.a.b = local_1f8;
        if (QVar27.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)QVar27.d.ptr = *(int *)QVar27.d.ptr + 1;
          UNLOCK();
        }
        local_68.a.a.m_size = (qsizetype)QVar27.d.ptr;
        QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                  (&local_188,local_238,(QString *)local_128,(QString *)&local_68);
        if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
            (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
          LOCK();
          *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
          UNLOCK();
          if (*(int *)local_68.a.a.m_size == 0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        local_1a8.d.size = -0x5555555555555556;
        local_1a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_1a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_68.a.a.m_size = (qsizetype)local_108.d.d;
        local_68.a.a.m_data = (char *)local_108.d.ptr;
        local_68.a.b = (QString *)local_108.d.size;
        if ((QSqlRecordPrivate *)local_108.d.d != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)local_108.d.d = *(int *)local_108.d.d + 1;
          UNLOCK();
        }
        QVar36.m_data = (char *)0x1;
        QVar36.m_size = (qsizetype)&local_68;
        pQVar15 = (QString *)QString::append(QVar36);
        plVar13 = (long *)QString::append(pQVar15);
        local_1a8.d.d = (Data *)*plVar13;
        local_1a8.d.ptr = (char16_t *)plVar13[1];
        local_1a8.d.size = (qsizetype)plVar13[2];
        if ((QSqlRelationalTableModelPrivate *)local_1a8.d.d !=
            (QSqlRelationalTableModelPrivate *)0x0) {
          LOCK();
          *(int *)&(((QSqlRelationalTableModelPrivate *)local_1a8.d.d)->super_QSqlTableModelPrivate)
                   .super_QSqlQueryModelPrivate =
               *(int *)&(((QSqlRelationalTableModelPrivate *)local_1a8.d.d)->
                        super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate + 1;
          UNLOCK();
        }
        if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
            (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
          LOCK();
          *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
          UNLOCK();
          if (*(int *)local_68.a.a.m_size == 0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        if (pQVar30->joinMode == InnerJoin) {
          pQVar15 = (QString *)local_168;
          if (((QSqlRelationalTableModelPrivate *)local_e8.d.size ==
               (QSqlRelationalTableModelPrivate *)0x0) ||
             (pQVar15 = &local_e8, local_158 == (QSqlRelationalTableModelPrivate *)0x0)) {
            local_1c0.d.d = (pQVar15->d).d;
            local_1c0.d.ptr = (pQVar15->d).ptr;
            pQVar12 = (QSqlRelationalTableModelPrivate *)(pQVar15->d).size;
            local_1c0.d.size = (qsizetype)pQVar12;
            if ((QSqlRelationalTableModelPrivate *)local_1c0.d.d !=
                (QSqlRelationalTableModelPrivate *)0x0) {
              LOCK();
              *(int *)&(((QSqlRelationalTableModelPrivate *)local_1c0.d.d)->
                       super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
                   (int)*(Type *)&(((QSqlRelationalTableModelPrivate *)local_1c0.d.d)->
                                  super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate + 1;
              UNLOCK();
            }
          }
          else {
            local_68.a.a.m_size = (qsizetype)local_e8.d.d;
            local_68.a.a.m_data = (char *)local_e8.d.ptr;
            local_68.a.b = (QString *)local_e8.d.size;
            if ((QSqlRecordPrivate *)local_e8.d.d != (QSqlRecordPrivate *)0x0) {
              LOCK();
              *(int *)local_e8.d.d = *(int *)local_e8.d.d + 1;
              UNLOCK();
            }
            QVar39.m_data = (char *)0x1;
            QVar39.m_size = (qsizetype)&local_68;
            pQVar15 = (QString *)QString::append(QVar39);
            puVar17 = (undefined8 *)QString::append(pQVar15);
            pQVar12 = (QSqlRelationalTableModelPrivate *)*puVar17;
            local_1c0.d.ptr = (char16_t *)puVar17[1];
            local_1c0.d.size = puVar17[2];
            if (pQVar12 != (QSqlRelationalTableModelPrivate *)0x0) {
              LOCK();
              *(int *)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
                   (int)*(Type *)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate
                   + 1;
              UNLOCK();
            }
            local_1c0.d.d = (Data *)pQVar12;
            if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
                (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
              LOCK();
              *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
              UNLOCK();
              if (*(int *)local_68.a.a.m_size == 0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
          }
          QString::operator=(&local_e8,&local_1c0);
          if ((QSqlRelationalTableModelPrivate *)local_1c0.d.d !=
              (QSqlRelationalTableModelPrivate *)0x0) {
            LOCK();
            *(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate =
                 *(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                          super_QSqlQueryModelPrivate + -1;
            UNLOCK();
            if (*(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                         super_QSqlQueryModelPrivate == 0) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          QSqlQueryModelSql::et((QString *)&local_68,(QString *)local_c8,&local_1a8);
          QString::operator=((QString *)local_c8,(QString *)&local_68);
          if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
              (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
            UNLOCK();
            if (*(int *)local_68.a.a.m_size == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        else {
          pQVar15 = &local_1d8;
          QSqlQueryModelSql::leftJoin(pQVar15,(QString *)local_168);
          if (((QSqlRelationalTableModelPrivate *)local_e8.d.size ==
               (QSqlRelationalTableModelPrivate *)0x0) ||
             (pQVar15 = &local_e8, local_1d8.d.size == 0)) {
            local_1c0.d.d = (pQVar15->d).d;
            local_1c0.d.ptr = (pQVar15->d).ptr;
            local_1c0.d.size = (pQVar15->d).size;
            if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_1c0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_1c0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          else {
            local_68.a.a.m_size = (qsizetype)local_e8.d.d;
            local_68.a.a.m_data = (char *)local_e8.d.ptr;
            local_68.a.b = (QString *)local_e8.d.size;
            if ((QSqlRecordPrivate *)local_e8.d.d != (QSqlRecordPrivate *)0x0) {
              LOCK();
              *(int *)local_e8.d.d = *(int *)local_e8.d.d + 1;
              UNLOCK();
            }
            QVar37.m_data = (char *)0x1;
            QVar37.m_size = (qsizetype)&local_68;
            pQVar15 = (QString *)QString::append(QVar37);
            puVar17 = (undefined8 *)QString::append(pQVar15);
            local_1c0.d.d = (Data *)*puVar17;
            local_1c0.d.ptr = (char16_t *)puVar17[1];
            local_1c0.d.size = puVar17[2];
            if ((QArrayData *)local_1c0.d.d != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((QArrayData *)local_1c0.d.d)->ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((QArrayData *)local_1c0.d.d)->ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
                (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
              LOCK();
              *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
              UNLOCK();
              if (*(int *)local_68.a.a.m_size == 0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
          }
          QString::operator=(&local_e8,&local_1c0);
          if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          pQVar15 = &local_1d8;
          QSqlQueryModelSql::on(pQVar15,&local_1a8);
          if (((QSqlRelationalTableModelPrivate *)local_e8.d.size ==
               (QSqlRelationalTableModelPrivate *)0x0) ||
             (pQVar15 = &local_e8, local_1d8.d.size == 0)) {
            local_1c0.d.d = (pQVar15->d).d;
            local_1c0.d.ptr = (pQVar15->d).ptr;
            pQVar12 = (QSqlRelationalTableModelPrivate *)(pQVar15->d).size;
            local_1c0.d.size = (qsizetype)pQVar12;
            if ((QSqlRelationalTableModelPrivate *)local_1c0.d.d !=
                (QSqlRelationalTableModelPrivate *)0x0) {
              LOCK();
              *(int *)&(((QSqlRelationalTableModelPrivate *)local_1c0.d.d)->
                       super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
                   (int)*(Type *)&(((QSqlRelationalTableModelPrivate *)local_1c0.d.d)->
                                  super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate + 1;
              UNLOCK();
            }
          }
          else {
            local_68.a.a.m_size = (qsizetype)local_e8.d.d;
            local_68.a.a.m_data = (char *)local_e8.d.ptr;
            local_68.a.b = (QString *)local_e8.d.size;
            if ((QSqlRecordPrivate *)local_e8.d.d != (QSqlRecordPrivate *)0x0) {
              LOCK();
              *(int *)local_e8.d.d = *(int *)local_e8.d.d + 1;
              UNLOCK();
            }
            QVar38.m_data = (char *)0x1;
            QVar38.m_size = (qsizetype)&local_68;
            pQVar15 = (QString *)QString::append(QVar38);
            puVar17 = (undefined8 *)QString::append(pQVar15);
            pQVar12 = (QSqlRelationalTableModelPrivate *)*puVar17;
            local_1c0.d.ptr = (char16_t *)puVar17[1];
            local_1c0.d.size = puVar17[2];
            if (pQVar12 != (QSqlRelationalTableModelPrivate *)0x0) {
              LOCK();
              *(int *)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate =
                   (int)*(Type *)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate
                   + 1;
              UNLOCK();
            }
            local_1c0.d.d = (Data *)pQVar12;
            if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
                (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
              LOCK();
              *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
              UNLOCK();
              if (*(int *)local_68.a.a.m_size == 0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
          }
          QString::operator=(&local_e8,&local_1c0);
          if ((QSqlRelationalTableModelPrivate *)local_1c0.d.d !=
              (QSqlRelationalTableModelPrivate *)0x0) {
            LOCK();
            *(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate =
                 *(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                          super_QSqlQueryModelPrivate + -1;
            UNLOCK();
            if (*(int *)&((QSqlTableModelPrivate *)&(local_1c0.d.d)->super_QArrayData)->
                         super_QSqlQueryModelPrivate == 0) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if ((QSqlRelationalTableModelPrivate *)local_1a8.d.d !=
            (QSqlRelationalTableModelPrivate *)0x0) {
          LOCK();
          *(int *)&((QSqlTableModelPrivate *)&(local_1a8.d.d)->super_QArrayData)->
                   super_QSqlQueryModelPrivate =
               *(int *)&((QSqlTableModelPrivate *)&(local_1a8.d.d)->super_QArrayData)->
                        super_QSqlQueryModelPrivate + -1;
          UNLOCK();
          if (*(int *)&((QSqlTableModelPrivate *)&(local_1a8.d.d)->super_QArrayData)->
                       super_QSqlQueryModelPrivate == 0) {
            QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QSqlRelationalTableModelPrivate *)local_188.d.d !=
            (QSqlRelationalTableModelPrivate *)0x0) {
          LOCK();
          *(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                   super_QSqlQueryModelPrivate =
               *(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                        super_QSqlQueryModelPrivate + -1;
          UNLOCK();
          if (*(int *)&((QSqlTableModelPrivate *)&(local_188.d.d)->super_QArrayData)->
                       super_QSqlQueryModelPrivate == 0) {
            QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_168 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate =
               *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate + -1;
          UNLOCK();
          if (*(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate == 0) {
            QArrayData::deallocate((QArrayData *)local_168,2,0x10);
          }
        }
        if ((QSqlRelationalTableModelPrivate *)local_148.d.d !=
            (QSqlRelationalTableModelPrivate *)0x0) {
          LOCK();
          *(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                   super_QSqlQueryModelPrivate =
               *(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                        super_QSqlQueryModelPrivate + -1;
          UNLOCK();
          if (*(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                       super_QSqlQueryModelPrivate == 0) {
            QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (local_128 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate + -1;
        UNLOCK();
        if (*(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate == 0) {
          QArrayData::deallocate((QArrayData *)local_128,2,0x10);
        }
      }
      if ((QSqlRelationalTableModelPrivate *)local_108.d.d != (QSqlRelationalTableModelPrivate *)0x0
         ) {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
                 super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
                      super_QSqlQueryModelPrivate + -1;
        UNLOCK();
        if (*(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
                     super_QSqlQueryModelPrivate == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)local_250.d.ptr = *(int *)local_250.d.ptr + -1;
        UNLOCK();
        if (*(int *)local_250.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_250.d.ptr,2,0x10);
        }
      }
      if (QVar27.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)QVar27.d.ptr = *(int *)QVar27.d.ptr + -1;
        UNLOCK();
        if (*(int *)QVar27.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)QVar27.d.ptr,2,0x10);
        }
      }
      if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)QVar24.d.ptr = *(int *)QVar24.d.ptr + -1;
        UNLOCK();
        if (*(int *)QVar24.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)QVar24.d.ptr,2,0x10);
        }
      }
      lVar31 = lVar31 + 1;
      iVar7 = QSqlRecord::count(this_00);
      lVar20 = lVar20 + 0x10;
      lVar29 = lVar29 + 0x18;
      __writefds = extraout_RDX_00;
    } while (lVar31 < iVar7);
  }
  if ((QSqlRelationalTableModelPrivate *)local_a8.d.size == (QSqlRelationalTableModelPrivate *)0x0)
  {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_188.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QSqlQueryModelSql::select
              ((int)&local_108,(fd_set *)&local_a8,__writefds,(fd_set *)pQVar12,in_R8);
    pQVar15 = &local_e8;
    if (((QSqlRelationalTableModelPrivate *)local_108.d.size ==
         (QSqlRelationalTableModelPrivate *)0x0) ||
       (pQVar15 = &local_108,
       (QSqlRelationalTableModelPrivate *)local_e8.d.size == (QSqlRelationalTableModelPrivate *)0x0)
       ) {
      QVar24.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(pQVar15->d).d;
      pQVar30 = (QSqlRelationalTableModelPrivate *)(pQVar15->d).ptr;
      local_188.d.d = (Data *)(pQVar15->d).size;
      if (QVar24.d.ptr == (QSqlRecordPrivate *)0x0) {
        QVar24.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
      }
      else {
        LOCK();
        *(__int_type *)
         &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar24.d.ptr)->super_QSharedData)->
          super_QSqlQueryModelPrivate =
             (__int_type)
             *(__atomic_base<int> *)
              &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar24.d.ptr)->super_QSharedData)->
               super_QSqlQueryModelPrivate + 1;
        UNLOCK();
      }
    }
    else {
      local_68.a.a.m_size = (qsizetype)local_108.d.d;
      local_68.a.a.m_data = (char *)local_108.d.ptr;
      local_68.a.b = (QString *)local_108.d.size;
      if ((QSqlRecordPrivate *)local_108.d.d != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)local_108.d.d = *(int *)local_108.d.d + 1;
        UNLOCK();
      }
      QVar40.m_data = (char *)0x1;
      QVar40.m_size = (qsizetype)&local_68;
      pQVar15 = (QString *)QString::append(QVar40);
      plVar13 = (long *)QString::append(pQVar15);
      QVar24.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)*plVar13;
      pQVar30 = (QSqlRelationalTableModelPrivate *)plVar13[1];
      local_188.d.d = (Data *)plVar13[2];
      if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(__int_type *)
         &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar24.d.ptr)->super_QSharedData)->
          super_QSqlQueryModelPrivate =
             (__int_type)
             *(__atomic_base<int> *)
              &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar24.d.ptr)->super_QSharedData)->
               super_QSqlQueryModelPrivate + 1;
        UNLOCK();
      }
      if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
          (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        LOCK();
        *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
        UNLOCK();
        if (*(int *)local_68.a.a.m_size == 0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
    }
    if ((QSqlRelationalTableModelPrivate *)local_108.d.d != (QSqlRelationalTableModelPrivate *)0x0)
    {
      LOCK();
      *(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
               super_QSqlQueryModelPrivate =
           *(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
                    super_QSqlQueryModelPrivate + -1;
      UNLOCK();
      if (*(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
                   super_QSqlQueryModelPrivate == 0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_108.d.size = -0x5555555555555556;
    local_108.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_108.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    if (local_b8 == 0) {
      local_128 = local_c8;
      auStack_120 = (undefined1  [8])pDStack_c0;
      local_118._0_8_ = (QSqlRelationalTableModelPrivate *)0x0;
      if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_c8 !=
          (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        LOCK();
        *(int *)local_c8 = *(int *)local_c8 + 1;
        UNLOCK();
      }
    }
    else {
      local_68.a.a.m_size = 1;
      local_68.a.a.m_data = "(";
      local_68.a.b = (QString *)local_c8;
      local_68.b.m_size = 1;
      local_68.b.m_data = (char *)((long)"QSqlDatabase(invalid)" + 0x14);
      QStringBuilder<QStringBuilder<const_QLatin1String,_const_QString_&>,_const_QLatin1String>::
      convertTo<QString>((QString *)local_128,&local_68);
    }
    pQVar12 = (QSqlRelationalTableModelPrivate *)local_168;
    QSqlTableModel::filter((QString *)pQVar12,(QSqlTableModel *)this);
    if (local_158 == (QSqlRelationalTableModelPrivate *)0x0) {
      local_148.d.d = (Data *)local_168;
      local_148.d.ptr = (char16_t *)pQStack_160;
      local_148.d.size = 0;
      if (local_168 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate + 1;
        UNLOCK();
      }
    }
    else {
      local_68.a.a.m_size = 1;
      local_68.a.a.m_data = "(";
      local_68.b.m_size = 1;
      local_68.b.m_data = (char *)((long)"QSqlDatabase(invalid)" + 0x14);
      local_68.a.b = (QString *)pQVar12;
      QStringBuilder<QStringBuilder<const_QLatin1String,_const_QString_&>,_const_QLatin1String>::
      convertTo<QString>(&local_148,&local_68);
    }
    pQVar15 = &local_148;
    QSqlQueryModelSql::et((QString *)&local_68,(QString *)local_128,pQVar15);
    QSqlQueryModelSql::where(&local_108,(QString *)&local_68);
    if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
        (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
      LOCK();
      *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
      UNLOCK();
      if (*(int *)local_68.a.a.m_size == 0) {
        QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
      }
    }
    if ((QSqlRelationalTableModelPrivate *)local_148.d.d != (QSqlRelationalTableModelPrivate *)0x0)
    {
      LOCK();
      *(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
               super_QSqlQueryModelPrivate =
           *(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                    super_QSqlQueryModelPrivate + -1;
      UNLOCK();
      if (*(int *)&((QSqlTableModelPrivate *)&(local_148.d.d)->super_QArrayData)->
                   super_QSqlQueryModelPrivate == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_168 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate =
           *(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate + -1;
      UNLOCK();
      if (*(int *)&((QSqlTableModelPrivate *)local_168)->super_QSqlQueryModelPrivate == 0) {
        QArrayData::deallocate((QArrayData *)local_168,2,0x10);
      }
    }
    if (local_128 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate =
           *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate + -1;
      UNLOCK();
      if (*(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate == 0) {
        QArrayData::deallocate((QArrayData *)local_128,2,0x10);
      }
    }
    if ((QSqlRelationalTableModelPrivate *)local_188.d.d == (QSqlRelationalTableModelPrivate *)0x0)
    {
      pqVar19 = &local_108.d.size;
      QVar27.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)
                     (totally_ordered_wrapper<QSqlRecordPrivate_*>)local_108.d.d;
      pQVar30 = (QSqlRelationalTableModelPrivate *)local_108.d.ptr;
LAB_0013387e:
      local_148.d.d = (Data *)pQVar30;
      local_168 = (undefined1  [8])*pqVar19;
      if (QVar27.d.ptr == (QSqlRecordPrivate *)0x0) {
        QVar27.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
      }
      else {
        LOCK();
        *(__int_type *)
         &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar27.d.ptr)->super_QSharedData)->
          super_QSqlQueryModelPrivate =
             (__int_type)
             *(__atomic_base<int> *)
              &((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar27.d.ptr)->super_QSharedData)->
               super_QSqlQueryModelPrivate + 1;
        UNLOCK();
      }
    }
    else {
      if ((QSqlRelationalTableModelPrivate *)local_108.d.size ==
          (QSqlRelationalTableModelPrivate *)0x0) {
        pqVar19 = (qsizetype *)&local_188;
        QVar27.d.ptr = QVar24.d.ptr;
        goto LAB_0013387e;
      }
      local_68.a.b = (QString *)local_188.d.d;
      if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)QVar24.d.ptr = *(int *)QVar24.d.ptr + 1;
        UNLOCK();
      }
      QVar41.m_data = (char *)0x1;
      QVar41.m_size = (qsizetype)&local_68;
      local_68.a.a.m_size = (qsizetype)QVar24.d.ptr;
      local_68.a.a.m_data = (char *)pQVar30;
      pQVar18 = (QString *)QString::append(QVar41);
      plVar13 = (long *)QString::append(pQVar18);
      QVar27.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)*plVar13;
      local_148.d.d = (Data *)plVar13[1];
      local_168 = (undefined1  [8])plVar13[2];
      if (QVar27.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar27.d.ptr)->super_QSharedData)
                 ->super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)
                      &((QSqlRecordPrivate *)QVar27.d.ptr)->super_QSharedData)->
                      super_QSqlQueryModelPrivate + 1;
        UNLOCK();
      }
      if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
          (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        LOCK();
        *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
        UNLOCK();
        if (*(int *)local_68.a.a.m_size == 0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
    }
    (**(code **)(*(long *)this + 0x1f0))(local_128);
    if (local_168 == (undefined1  [8])0x0) {
      pQVar15 = (QString *)auStack_120;
      pQVar12 = (QSqlRelationalTableModelPrivate *)(auStack_120 + 8);
      QVar16.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)
                     (totally_ordered_wrapper<QSqlRecordPrivate_*>)local_128;
LAB_0013398e:
      (__return_storage_ptr__->d).d = (Data *)QVar16.d.ptr;
      (__return_storage_ptr__->d).ptr = (char16_t *)(pQVar15->d).d;
      (__return_storage_ptr__->d).size =
           (qsizetype)*(Data **)&(pQVar12->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate;
      if (QVar16.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)&((QSqlTableModelPrivate *)&((QSqlRecordPrivate *)QVar16.d.ptr)->super_QSharedData)
                 ->super_QSqlQueryModelPrivate =
             *(int *)&((QSqlTableModelPrivate *)
                      &((QSqlRecordPrivate *)QVar16.d.ptr)->super_QSharedData)->
                      super_QSqlQueryModelPrivate + 1;
        UNLOCK();
      }
    }
    else {
      QVar16.d.ptr = QVar27.d.ptr;
      if ((QSqlRelationalTableModelPrivate *)local_118._0_8_ ==
          (QSqlRelationalTableModelPrivate *)0x0) goto LAB_0013398e;
      local_68.a.a.m_data = (char *)local_148.d.d;
      local_68.a.b = (QString *)local_168;
      if (QVar27.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)QVar27.d.ptr = *(int *)QVar27.d.ptr + 1;
        UNLOCK();
      }
      QVar42.m_data = (char *)0x1;
      QVar42.m_size = (qsizetype)&local_68;
      local_68.a.a.m_size = (qsizetype)QVar27.d.ptr;
      pQVar15 = (QString *)QString::append(QVar42);
      plVar13 = (long *)QString::append(pQVar15);
      pDVar3 = (Data *)*plVar13;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = (char16_t *)plVar13[1];
      (__return_storage_ptr__->d).size = plVar13[2];
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_68.a.a.m_size !=
          (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        LOCK();
        *(int *)local_68.a.a.m_size = *(int *)local_68.a.a.m_size + -1;
        UNLOCK();
        if (*(int *)local_68.a.a.m_size == 0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
    }
    if (local_128 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate =
           *(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate + -1;
      UNLOCK();
      if (*(int *)&((QSqlTableModelPrivate *)local_128)->super_QSqlQueryModelPrivate == 0) {
        QArrayData::deallocate((QArrayData *)local_128,2,0x10);
      }
    }
    if (QVar27.d.ptr != (QSqlRecordPrivate *)0x0) {
      LOCK();
      *(int *)QVar27.d.ptr = *(int *)QVar27.d.ptr + -1;
      UNLOCK();
      if (*(int *)QVar27.d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)QVar27.d.ptr,2,0x10);
      }
    }
    if ((QSqlRelationalTableModelPrivate *)local_108.d.d != (QSqlRelationalTableModelPrivate *)0x0)
    {
      LOCK();
      *(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
               super_QSqlQueryModelPrivate =
           *(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
                    super_QSqlQueryModelPrivate + -1;
      UNLOCK();
      if (*(int *)&((QSqlTableModelPrivate *)&(local_108.d.d)->super_QArrayData)->
                   super_QSqlQueryModelPrivate == 0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (QVar24.d.ptr != (QSqlRecordPrivate *)0x0) {
      LOCK();
      *(int *)QVar24.d.ptr = *(int *)QVar24.d.ptr + -1;
      UNLOCK();
      if (*(int *)QVar24.d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)QVar24.d.ptr,2,0x10);
      }
    }
  }
  if ((QSqlRelationalTableModelPrivate *)local_e8.d.d != (QSqlRelationalTableModelPrivate *)0x0) {
    LOCK();
    *(int *)&((QSqlTableModelPrivate *)&(local_e8.d.d)->super_QArrayData)->
             super_QSqlQueryModelPrivate =
         *(int *)&((QSqlTableModelPrivate *)&(local_e8.d.d)->super_QArrayData)->
                  super_QSqlQueryModelPrivate + -1;
    UNLOCK();
    if (*(int *)&((QSqlTableModelPrivate *)&(local_e8.d.d)->super_QArrayData)->
                 super_QSqlQueryModelPrivate == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((totally_ordered_wrapper<QSqlRecordPrivate_*>)local_c8 !=
      (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
    LOCK();
    *(int *)local_c8 = *(int *)local_c8 + -1;
    UNLOCK();
    if (*(int *)local_c8 == 0) {
      QArrayData::deallocate((QArrayData *)local_c8,2,0x10);
    }
  }
  if ((QSqlRelationalTableModelPrivate *)local_a8.d.d != (QSqlRelationalTableModelPrivate *)0x0) {
    LOCK();
    *(int *)&((QSqlTableModelPrivate *)&(local_a8.d.d)->super_QArrayData)->
             super_QSqlQueryModelPrivate =
         *(int *)&((QSqlTableModelPrivate *)&(local_a8.d.d)->super_QArrayData)->
                  super_QSqlQueryModelPrivate + -1;
    UNLOCK();
    if (*(int *)&((QSqlTableModelPrivate *)&(local_a8.d.d)->super_QArrayData)->
                 super_QSqlQueryModelPrivate == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  QHash<QString,_int>::~QHash(&local_70);
LAB_00133acd:
  if (*(quintptr *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlRelationalTableModel::selectStatement() const
{
    Q_D(const QSqlRelationalTableModel);

    if (tableName().isEmpty())
        return QString();
    if (d->relations.isEmpty())
        return QSqlTableModel::selectStatement();

    // Count how many times each field name occurs in the record
    QHash<QString, int> fieldNames;
    QStringList fieldList;
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        QString name;
        if (relation.isValid()) {
            // Count the display column name, not the original foreign key
            name = relation.displayColumn();
            if (d->db.driver()->isIdentifierEscaped(name, QSqlDriver::FieldName))
                name = d->db.driver()->stripDelimiters(name, QSqlDriver::FieldName);

            const QSqlRecord rec = database().record(relation.tableName());
            for (int i = 0; i < rec.count(); ++i) {
                if (name.compare(rec.fieldName(i), Qt::CaseInsensitive) == 0) {
                    name = rec.fieldName(i);
                    break;
                }
            }
        }
        else {
            name = d->baseRec.fieldName(i);
        }
        fieldNames[name] = fieldNames.value(name, 0) + 1;
        fieldList.append(name);
    }

    QString fList;
    QString conditions;
    QString from = SqlrTm::from(tableName());
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        const QString tableField = d->fullyQualifiedFieldName(tableName(), d->db.driver()->escapeIdentifier(d->baseRec.fieldName(i), QSqlDriver::FieldName));
        if (relation.isValid()) {
            const QString relTableAlias = SqlrTm::relTablePrefix(i);
            QString displayTableField = d->fullyQualifiedFieldName(relTableAlias, relation.displayColumn());

            // Duplicate field names must be aliased
            if (fieldNames.value(fieldList[i]) > 1) {
                QString relTableName = relation.tableName().section(QChar::fromLatin1('.'), -1, -1);
                if (d->db.driver()->isIdentifierEscaped(relTableName, QSqlDriver::TableName))
                    relTableName = d->db.driver()->stripDelimiters(relTableName, QSqlDriver::TableName);
                QString displayColumn = relation.displayColumn();
                if (d->db.driver()->isIdentifierEscaped(displayColumn, QSqlDriver::FieldName))
                    displayColumn = d->db.driver()->stripDelimiters(displayColumn, QSqlDriver::FieldName);
                QString alias = QString::fromLatin1("%1_%2_%3")
                                      .arg(relTableName, displayColumn, QString::number(fieldNames.value(fieldList[i])));
                alias.truncate(d->db.driver()->maximumIdentifierLength(QSqlDriver::FieldName));
                alias = d->db.driver()->escapeIdentifier(alias, QSqlDriver::FieldName);
                displayTableField = SqlrTm::as(displayTableField, alias);
                --fieldNames[fieldList[i]];
            }

            fList = SqlrTm::comma(fList, displayTableField);

            // Join related table
            const QString tblexpr = SqlrTm::concat(relation.tableName(), relTableAlias);
            const QString relTableField = d->fullyQualifiedFieldName(relTableAlias, relation.indexColumn());
            const QString cond = SqlrTm::eq(tableField, relTableField);
            if (d->joinMode == QSqlRelationalTableModel::InnerJoin) {
                // FIXME: InnerJoin code is known to be broken.
                // Use LeftJoin mode if you want correct behavior.
                from = SqlrTm::comma(from, tblexpr);
                conditions = SqlrTm::et(conditions, cond);
            } else {
                from = SqlrTm::concat(from, SqlrTm::leftJoin(tblexpr));
                from = SqlrTm::concat(from, SqlrTm::on(cond));
            }
        } else {
            fList = SqlrTm::comma(fList, tableField);
        }
    }

    if (fList.isEmpty())
        return QString();

    const QString stmt = SqlrTm::concat(SqlrTm::select(fList), from);
    const QString where = SqlrTm::where(SqlrTm::et(SqlrTm::paren(conditions), SqlrTm::paren(filter())));
    return SqlrTm::concat(SqlrTm::concat(stmt, where), orderByClause());
}